

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_transaction_context.cpp
# Opt level: O2

void __thiscall
TransactionContext_Input_Output_Test::TestBody(TransactionContext_Input_Output_Test *this)

{
  _Alloc_hider _Var1;
  bool bVar2;
  uint32_t uVar3;
  char *pcVar4;
  _func_int *p_Var5;
  string local_1d50;
  undefined1 local_1d30 [56];
  AssertionResult gtest_ar_4;
  vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> ref_list;
  AssertionResult gtest_ar_15;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexes;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  UtxoData utxo_stub;
  TransactionContext ctx;
  Address address1;
  Address address2;
  UtxoData utxo4;
  UtxoData utxo3;
  UtxoData utxo2;
  UtxoData utxo1;
  
  cfd::UtxoData::UtxoData(&utxo1);
  std::__cxx11::string::string
            ((string *)&utxo3,"9e1ead91c432889cb478237da974dd1e9009c9e22694fd1e3999c40a1ef59b0a",
             (allocator *)&utxo4);
  cfd::core::Txid::Txid((Txid *)&utxo2,(string *)&utxo3);
  cfd::core::Txid::operator=(&utxo1.txid,(Txid *)&utxo2);
  cfd::core::Txid::~Txid((Txid *)&utxo2);
  std::__cxx11::string::~string((string *)&utxo3);
  utxo1.vout = 1;
  utxo1.address_type = kP2wpkhAddress;
  cfd::UtxoData::UtxoData(&utxo2);
  std::__cxx11::string::string
            ((string *)&utxo4,"8f4af7ee42e62a3d32f25ca56f618fb2f5df3d4c3a9c59e2c3646c5535a3d40a",
             (allocator *)&utxo_stub);
  cfd::core::Txid::Txid((Txid *)&utxo3,(string *)&utxo4);
  cfd::core::Txid::operator=(&utxo2.txid,(Txid *)&utxo3);
  cfd::core::Txid::~Txid((Txid *)&utxo3);
  std::__cxx11::string::~string((string *)&utxo4);
  utxo2.vout = 2;
  utxo2.address_type = kP2wpkhAddress;
  cfd::UtxoData::UtxoData(&utxo3);
  std::__cxx11::string::string
            ((string *)&utxo_stub,"b9720ed2265a4ced42425bffdb4ef90a473b4106811a802fce53f7c57487fa0b"
             ,(allocator *)&address1);
  cfd::core::Txid::Txid((Txid *)&utxo4,(string *)&utxo_stub);
  cfd::core::Txid::operator=(&utxo3.txid,(Txid *)&utxo4);
  cfd::core::Txid::~Txid((Txid *)&utxo4);
  std::__cxx11::string::~string((string *)&utxo_stub);
  utxo3.vout = 3;
  utxo3.address_type = kP2wpkhAddress;
  cfd::UtxoData::UtxoData(&utxo4);
  std::__cxx11::string::string
            ((string *)&address1,"0f093988839178ea5895431241cb4400fb31dd7b665a1a93cbd372336c717e0c",
             (allocator *)&address2);
  cfd::core::Txid::Txid((Txid *)&utxo_stub,(string *)&address1);
  cfd::core::Txid::operator=(&utxo4.txid,(Txid *)&utxo_stub);
  cfd::core::Txid::~Txid((Txid *)&utxo_stub);
  std::__cxx11::string::~string((string *)&address1);
  utxo4.vout = kP2wpkhAddress;
  utxos.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  utxos.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  utxos.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  utxo4.address_type = utxo4.vout;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::push_back(&utxos,&utxo3);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::push_back(&utxos,&utxo4);
  cfd::TransactionContext::TransactionContext(&ctx,2,0);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::TransactionContext::AddInput(&ctx,&utxo1);
    }
  }
  else {
    testing::Message::Message((Message *)&utxo_stub);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&address1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x129,
               "Expected: ctx.AddInput(utxo1) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)&address1,(Message *)&utxo_stub);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&address1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&utxo_stub);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::TransactionContext::AddInput(&ctx,&utxo2,0xf0ffffff);
    }
  }
  else {
    testing::Message::Message((Message *)&utxo_stub);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&address1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x12a,
               "Expected: ctx.AddInput(utxo2, 0xf0ffffff) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&address1,(Message *)&utxo_stub);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&address1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&utxo_stub);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::TransactionContext::AddInputs(&ctx,&utxos);
    }
  }
  else {
    testing::Message::Message((Message *)&utxo_stub);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&address1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,299,
               "Expected: ctx.AddInputs(utxos) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)&address1,(Message *)&utxo_stub);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&address1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&utxo_stub);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&indexes,2,(allocator_type *)&utxo_stub);
  std::__cxx11::string::string
            ((string *)&utxo_stub,"3K4cCA6U45jhvBcgc8qEdjHGDGyUMuVRpG",(allocator *)&address2);
  cfd::core::Address::Address(&address1,(string *)&utxo_stub);
  std::__cxx11::string::~string((string *)&utxo_stub);
  std::__cxx11::string::string
            ((string *)&utxo_stub,"bc1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5uax7v9q",
             (allocator *)local_1d30);
  cfd::core::Address::Address(&address2,(string *)&utxo_stub);
  std::__cxx11::string::~string((string *)&utxo_stub);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::Amount::Amount((Amount *)&utxo_stub,0.1);
      uVar3 = cfd::TransactionContext::AddTxOut(&ctx,&address1,(Amount *)&utxo_stub);
      *indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start = uVar3;
    }
  }
  else {
    testing::Message::Message((Message *)&utxo_stub);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1d30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x12f,
               "Expected: indexes[0] = ctx.AddTxOut(address1, Amount(0.1)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1d30,(Message *)&utxo_stub);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1d30);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&utxo_stub);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::Amount::Amount((Amount *)&utxo_stub,0.01);
      uVar3 = cfd::TransactionContext::AddTxOut(&ctx,&address2,(Amount *)&utxo_stub);
      indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[1] = uVar3;
    }
  }
  else {
    testing::Message::Message((Message *)&utxo_stub);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1d30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x130,
               "Expected: indexes[1] = ctx.AddTxOut(address2, Amount(0.01)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1d30,(Message *)&utxo_stub);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1d30);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&utxo_stub);
  }
  local_1d30._0_4_ = cfd::core::Transaction::GetTxInCount(&ctx.super_Transaction);
  local_1d50._M_dataplus._M_p._0_4_ = 4;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&utxo_stub,"ctx.GetTxInCount()","4",(uint *)local_1d30,(int *)&local_1d50);
  if ((char)utxo_stub.block_height == '\0') {
    testing::Message::Message((Message *)local_1d30);
    if (utxo_stub.block_hash._vptr_BlockHash == (_func_int **)0x0) {
      p_Var5 = (_func_int *)0x530a9d;
    }
    else {
      p_Var5 = *utxo_stub.block_hash._vptr_BlockHash;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1d50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x132,(char *)p_Var5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d50,(Message *)local_1d30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_1d30);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&utxo_stub.block_hash);
  uVar3 = cfd::core::Transaction::GetTxOutCount(&ctx.super_Transaction);
  local_1d30._0_4_ = uVar3;
  local_1d50._M_dataplus._M_p._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&utxo_stub,"ctx.GetTxOutCount()","2",(uint *)local_1d30,(int *)&local_1d50)
  ;
  if ((char)utxo_stub.block_height == '\0') {
    testing::Message::Message((Message *)local_1d30);
    if (utxo_stub.block_hash._vptr_BlockHash == (_func_int **)0x0) {
      p_Var5 = (_func_int *)0x530a9d;
    }
    else {
      p_Var5 = *utxo_stub.block_hash._vptr_BlockHash;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1d50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x133,(char *)p_Var5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d50,(Message *)local_1d30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_1d30);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&utxo_stub.block_hash);
  uVar3 = cfd::TransactionContext::GetSizeIgnoreTxIn(&ctx,true);
  local_1d30._0_4_ = uVar3;
  local_1d50._M_dataplus._M_p._0_4_ = 0x4b;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&utxo_stub,"ctx.GetSizeIgnoreTxIn()","75",(uint *)local_1d30,
             (int *)&local_1d50);
  if ((char)utxo_stub.block_height == '\0') {
    testing::Message::Message((Message *)local_1d30);
    if (utxo_stub.block_hash._vptr_BlockHash == (_func_int **)0x0) {
      p_Var5 = (_func_int *)0x530a9d;
    }
    else {
      p_Var5 = *utxo_stub.block_hash._vptr_BlockHash;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1d50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x134,(char *)p_Var5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d50,(Message *)local_1d30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_1d30);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&utxo_stub.block_hash);
  uVar3 = cfd::TransactionContext::GetVsizeIgnoreTxIn(&ctx,true);
  local_1d30._0_4_ = uVar3;
  local_1d50._M_dataplus._M_p._0_4_ = 0x4b;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&utxo_stub,"ctx.GetVsizeIgnoreTxIn()","75",(uint *)local_1d30,
             (int *)&local_1d50);
  if ((char)utxo_stub.block_height == '\0') {
    testing::Message::Message((Message *)local_1d30);
    if (utxo_stub.block_hash._vptr_BlockHash == (_func_int **)0x0) {
      p_Var5 = (_func_int *)0x530a9d;
    }
    else {
      p_Var5 = *utxo_stub.block_hash._vptr_BlockHash;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1d50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x135,(char *)p_Var5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d50,(Message *)local_1d30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_1d30);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&utxo_stub.block_hash);
  uVar3 = cfd::core::Transaction::GetTxInCount(&ctx.super_Transaction);
  if (uVar3 == 4) {
    cfd::core::Transaction::GetTxInList(&ref_list,&ctx.super_Transaction);
    cfd::core::Txid::Txid
              ((Txid *)local_1d30,
               &((ref_list.
                  super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>
                  ._M_impl.super__Vector_impl_data._M_start)->super_AbstractTxInReference).txid_);
    cfd::core::Txid::GetHex_abi_cxx11_((string *)&utxo_stub,(Txid *)local_1d30);
    pcVar4 = (char *)CONCAT71(utxo_stub.block_height._1_7_,(char)utxo_stub.block_height);
    cfd::core::Txid::GetHex_abi_cxx11_(&local_1d50,&utxo1.txid);
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar_4,"ref_list[0].GetTxid().GetHex().c_str()",
               "utxo1.txid.GetHex().c_str()",pcVar4,local_1d50._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_1d50);
    std::__cxx11::string::~string((string *)&utxo_stub);
    cfd::core::Txid::~Txid((Txid *)local_1d30);
    if (gtest_ar_4.success_ == false) {
      testing::Message::Message((Message *)&utxo_stub);
      if (gtest_ar_4.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_1d30,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
                 ,0x138,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_1d30,(Message *)&utxo_stub);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1d30);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&utxo_stub);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_4.message_);
    cfd::core::Txid::Txid
              ((Txid *)local_1d30,
               &ref_list.
                super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>
                ._M_impl.super__Vector_impl_data._M_start[1].super_AbstractTxInReference.txid_);
    cfd::core::Txid::GetHex_abi_cxx11_((string *)&utxo_stub,(Txid *)local_1d30);
    pcVar4 = (char *)CONCAT71(utxo_stub.block_height._1_7_,(char)utxo_stub.block_height);
    cfd::core::Txid::GetHex_abi_cxx11_(&local_1d50,&utxo2.txid);
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar_4,"ref_list[1].GetTxid().GetHex().c_str()",
               "utxo2.txid.GetHex().c_str()",pcVar4,local_1d50._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_1d50);
    std::__cxx11::string::~string((string *)&utxo_stub);
    cfd::core::Txid::~Txid((Txid *)local_1d30);
    if (gtest_ar_4.success_ == false) {
      testing::Message::Message((Message *)&utxo_stub);
      if (gtest_ar_4.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_1d30,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
                 ,0x139,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_1d30,(Message *)&utxo_stub);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1d30);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&utxo_stub);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_4.message_);
    cfd::core::Txid::Txid
              ((Txid *)local_1d30,
               &ref_list.
                super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>
                ._M_impl.super__Vector_impl_data._M_start[2].super_AbstractTxInReference.txid_);
    cfd::core::Txid::GetHex_abi_cxx11_((string *)&utxo_stub,(Txid *)local_1d30);
    pcVar4 = (char *)CONCAT71(utxo_stub.block_height._1_7_,(char)utxo_stub.block_height);
    cfd::core::Txid::GetHex_abi_cxx11_(&local_1d50,&utxo3.txid);
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar_4,"ref_list[2].GetTxid().GetHex().c_str()",
               "utxo3.txid.GetHex().c_str()",pcVar4,local_1d50._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_1d50);
    std::__cxx11::string::~string((string *)&utxo_stub);
    cfd::core::Txid::~Txid((Txid *)local_1d30);
    if (gtest_ar_4.success_ == false) {
      testing::Message::Message((Message *)&utxo_stub);
      if (gtest_ar_4.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_1d30,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
                 ,0x13a,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_1d30,(Message *)&utxo_stub);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1d30);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&utxo_stub);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_4.message_);
    cfd::core::Txid::Txid
              ((Txid *)local_1d30,
               &ref_list.
                super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>
                ._M_impl.super__Vector_impl_data._M_start[3].super_AbstractTxInReference.txid_);
    cfd::core::Txid::GetHex_abi_cxx11_((string *)&utxo_stub,(Txid *)local_1d30);
    pcVar4 = (char *)CONCAT71(utxo_stub.block_height._1_7_,(char)utxo_stub.block_height);
    cfd::core::Txid::GetHex_abi_cxx11_(&local_1d50,&utxo4.txid);
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar_4,"ref_list[3].GetTxid().GetHex().c_str()",
               "utxo4.txid.GetHex().c_str()",pcVar4,local_1d50._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_1d50);
    std::__cxx11::string::~string((string *)&utxo_stub);
    cfd::core::Txid::~Txid((Txid *)local_1d30);
    if (gtest_ar_4.success_ == false) {
      testing::Message::Message((Message *)&utxo_stub);
      if (gtest_ar_4.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_1d30,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
                 ,0x13b,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_1d30,(Message *)&utxo_stub);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1d30);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&utxo_stub);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_4.message_);
    local_1d30._0_4_ =
         ((ref_list.
           super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>.
           _M_impl.super__Vector_impl_data._M_start)->super_AbstractTxInReference).vout_;
    local_1d50._M_dataplus._M_p._0_4_ = 1;
    testing::internal::CmpHelperEQ<unsigned_int,int>
              ((internal *)&utxo_stub,"ref_list[0].GetVout()","1",(uint *)local_1d30,
               (int *)&local_1d50);
    if ((char)utxo_stub.block_height == '\0') {
      testing::Message::Message((Message *)local_1d30);
      if (utxo_stub.block_hash._vptr_BlockHash == (_func_int **)0x0) {
        p_Var5 = (_func_int *)0x530a9d;
      }
      else {
        p_Var5 = *utxo_stub.block_hash._vptr_BlockHash;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1d50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
                 ,0x13c,(char *)p_Var5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d50,(Message *)local_1d30);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d50);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_1d30);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&utxo_stub.block_hash);
    local_1d30._0_4_ =
         ref_list.
         super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>.
         _M_impl.super__Vector_impl_data._M_start[1].super_AbstractTxInReference.vout_;
    local_1d50._M_dataplus._M_p._0_4_ = 2;
    testing::internal::CmpHelperEQ<unsigned_int,int>
              ((internal *)&utxo_stub,"ref_list[1].GetVout()","2",(uint *)local_1d30,
               (int *)&local_1d50);
    if ((char)utxo_stub.block_height == '\0') {
      testing::Message::Message((Message *)local_1d30);
      if (utxo_stub.block_hash._vptr_BlockHash == (_func_int **)0x0) {
        p_Var5 = (_func_int *)0x530a9d;
      }
      else {
        p_Var5 = *utxo_stub.block_hash._vptr_BlockHash;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1d50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
                 ,0x13d,(char *)p_Var5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d50,(Message *)local_1d30);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d50);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_1d30);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&utxo_stub.block_hash);
    local_1d30._0_4_ =
         ref_list.
         super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>.
         _M_impl.super__Vector_impl_data._M_start[2].super_AbstractTxInReference.vout_;
    local_1d50._M_dataplus._M_p._0_4_ = 3;
    testing::internal::CmpHelperEQ<unsigned_int,int>
              ((internal *)&utxo_stub,"ref_list[2].GetVout()","3",(uint *)local_1d30,
               (int *)&local_1d50);
    if ((char)utxo_stub.block_height == '\0') {
      testing::Message::Message((Message *)local_1d30);
      if (utxo_stub.block_hash._vptr_BlockHash == (_func_int **)0x0) {
        p_Var5 = (_func_int *)0x530a9d;
      }
      else {
        p_Var5 = *utxo_stub.block_hash._vptr_BlockHash;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1d50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
                 ,0x13e,(char *)p_Var5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d50,(Message *)local_1d30);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d50);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_1d30);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&utxo_stub.block_hash);
    local_1d30._0_4_ =
         ref_list.
         super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>.
         _M_impl.super__Vector_impl_data._M_start[3].super_AbstractTxInReference.vout_;
    local_1d50._M_dataplus._M_p._0_4_ = 4;
    testing::internal::CmpHelperEQ<unsigned_int,int>
              ((internal *)&utxo_stub,"ref_list[3].GetVout()","4",(uint *)local_1d30,
               (int *)&local_1d50);
    if ((char)utxo_stub.block_height == '\0') {
      testing::Message::Message((Message *)local_1d30);
      if (utxo_stub.block_hash._vptr_BlockHash == (_func_int **)0x0) {
        p_Var5 = (_func_int *)0x530a9d;
      }
      else {
        p_Var5 = *utxo_stub.block_hash._vptr_BlockHash;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1d50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
                 ,0x13f,(char *)p_Var5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d50,(Message *)local_1d30);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d50);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_1d30);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&utxo_stub.block_hash);
    local_1d30._0_4_ =
         ref_list.
         super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>.
         _M_impl.super__Vector_impl_data._M_start[1].super_AbstractTxInReference.sequence_;
    local_1d50._M_dataplus._M_p._0_4_ = 0xf0ffffff;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              ((internal *)&utxo_stub,"ref_list[1].GetSequence()","0xf0ffffff",(uint *)local_1d30,
               (uint *)&local_1d50);
    if ((char)utxo_stub.block_height == '\0') {
      testing::Message::Message((Message *)local_1d30);
      if (utxo_stub.block_hash._vptr_BlockHash == (_func_int **)0x0) {
        p_Var5 = (_func_int *)0x530a9d;
      }
      else {
        p_Var5 = *utxo_stub.block_hash._vptr_BlockHash;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1d50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
                 ,0x140,(char *)p_Var5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d50,(Message *)local_1d30);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d50);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_1d30);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&utxo_stub.block_hash);
    std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>::~vector
              (&ref_list);
  }
  uVar3 = cfd::core::Transaction::GetTxOutCount(&ctx.super_Transaction);
  if (uVar3 == 2) {
    local_1d30._0_8_ = local_1d30._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<unsigned_int,int>
              ((internal *)&utxo_stub,"indexes[0]","0",
               indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,(int *)local_1d30);
    if ((char)utxo_stub.block_height == '\0') {
      testing::Message::Message((Message *)local_1d30);
      if (utxo_stub.block_hash._vptr_BlockHash == (_func_int **)0x0) {
        p_Var5 = (_func_int *)0x530a9d;
      }
      else {
        p_Var5 = *utxo_stub.block_hash._vptr_BlockHash;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1d50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
                 ,0x143,(char *)p_Var5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d50,(Message *)local_1d30);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d50);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_1d30);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&utxo_stub.block_hash);
    local_1d30._0_4_ = 1;
    testing::internal::CmpHelperEQ<unsigned_int,int>
              ((internal *)&utxo_stub,"indexes[1]","1",
               indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start + 1,(int *)local_1d30);
    if ((char)utxo_stub.block_height == '\0') {
      testing::Message::Message((Message *)local_1d30);
      if (utxo_stub.block_hash._vptr_BlockHash == (_func_int **)0x0) {
        p_Var5 = (_func_int *)0x530a9d;
      }
      else {
        p_Var5 = *utxo_stub.block_hash._vptr_BlockHash;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1d50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
                 ,0x144,(char *)p_Var5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d50,(Message *)local_1d30);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d50);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_1d30);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&utxo_stub.block_hash);
    cfd::core::Transaction::GetTxOutList
              ((vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> *)
               &gtest_ar_4,&ctx.super_Transaction);
    cfd::core::Script::Script
              ((Script *)&utxo_stub,
               (Script *)(CONCAT71(gtest_ar_4._1_7_,gtest_ar_4.success_) + 0x18));
    cfd::core::Script::GetHex_abi_cxx11_(&local_1d50,(Script *)&utxo_stub);
    _Var1._M_p = local_1d50._M_dataplus._M_p;
    cfd::core::Address::GetLockingScript((Script *)local_1d30,&address1);
    cfd::core::Script::GetHex_abi_cxx11_((string *)&ref_list,(Script *)local_1d30);
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar_15,"ref_list[0].GetLockingScript().GetHex().c_str()",
               "address1.GetLockingScript().GetHex().c_str()",_Var1._M_p,
               (char *)ref_list.
                       super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    std::__cxx11::string::~string((string *)&ref_list);
    cfd::core::Script::~Script((Script *)local_1d30);
    std::__cxx11::string::~string((string *)&local_1d50);
    cfd::core::Script::~Script((Script *)&utxo_stub);
    if (gtest_ar_15.success_ == false) {
      testing::Message::Message((Message *)&utxo_stub);
      if (gtest_ar_15.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((gtest_ar_15.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_1d30,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
                 ,0x147,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_1d30,(Message *)&utxo_stub);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1d30);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&utxo_stub);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_15.message_);
    cfd::core::Script::Script
              ((Script *)&utxo_stub,
               (Script *)(CONCAT71(gtest_ar_4._1_7_,gtest_ar_4.success_) + 0x68));
    cfd::core::Script::GetHex_abi_cxx11_(&local_1d50,(Script *)&utxo_stub);
    _Var1._M_p = local_1d50._M_dataplus._M_p;
    cfd::core::Address::GetLockingScript((Script *)local_1d30,&address2);
    cfd::core::Script::GetHex_abi_cxx11_((string *)&ref_list,(Script *)local_1d30);
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar_15,"ref_list[1].GetLockingScript().GetHex().c_str()",
               "address2.GetLockingScript().GetHex().c_str()",_Var1._M_p,
               (char *)ref_list.
                       super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    std::__cxx11::string::~string((string *)&ref_list);
    cfd::core::Script::~Script((Script *)local_1d30);
    std::__cxx11::string::~string((string *)&local_1d50);
    cfd::core::Script::~Script((Script *)&utxo_stub);
    if (gtest_ar_15.success_ == false) {
      testing::Message::Message((Message *)&utxo_stub);
      if (gtest_ar_15.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((gtest_ar_15.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_1d30,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
                 ,0x149,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_1d30,(Message *)&utxo_stub);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1d30);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&utxo_stub);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_15.message_);
    local_1d30._0_8_ = *(undefined8 *)(CONCAT71(gtest_ar_4._1_7_,gtest_ar_4.success_) + 8);
    local_1d30[8] = *(undefined1 *)(CONCAT71(gtest_ar_4._1_7_,gtest_ar_4.success_) + 0x10);
    local_1d50._M_dataplus._M_p = (pointer)cfd::core::Amount::GetCoinValue((Amount *)local_1d30);
    ref_list.super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3fb999999999999a;
    testing::internal::CmpHelperEQ<double,double>
              ((internal *)&utxo_stub,"ref_list[0].GetValue().GetCoinValue()","0.1",
               (double *)&local_1d50,(double *)&ref_list);
    if ((char)utxo_stub.block_height == '\0') {
      testing::Message::Message((Message *)local_1d30);
      if (utxo_stub.block_hash._vptr_BlockHash == (_func_int **)0x0) {
        p_Var5 = (_func_int *)0x530a9d;
      }
      else {
        p_Var5 = *utxo_stub.block_hash._vptr_BlockHash;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1d50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
                 ,0x14a,(char *)p_Var5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d50,(Message *)local_1d30);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d50);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_1d30);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&utxo_stub.block_hash);
    local_1d30._0_8_ = *(ulong *)(CONCAT71(gtest_ar_4._1_7_,gtest_ar_4.success_) + 0x58);
    local_1d30[8] = *(undefined1 *)(CONCAT71(gtest_ar_4._1_7_,gtest_ar_4.success_) + 0x60);
    local_1d50._M_dataplus._M_p = (pointer)cfd::core::Amount::GetCoinValue((Amount *)local_1d30);
    ref_list.super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3f847ae147ae147b;
    testing::internal::CmpHelperEQ<double,double>
              ((internal *)&utxo_stub,"ref_list[1].GetValue().GetCoinValue()","0.01",
               (double *)&local_1d50,(double *)&ref_list);
    if ((char)utxo_stub.block_height == '\0') {
      testing::Message::Message((Message *)local_1d30);
      if (utxo_stub.block_hash._vptr_BlockHash == (_func_int **)0x0) {
        p_Var5 = (_func_int *)0x530a9d;
      }
      else {
        p_Var5 = *utxo_stub.block_hash._vptr_BlockHash;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1d50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
                 ,0x14b,(char *)p_Var5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d50,(Message *)local_1d30);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d50);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_1d30);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&utxo_stub.block_hash);
    std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>::~vector
              ((vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> *)
               &gtest_ar_4);
  }
  cfd::UtxoData::UtxoData(&utxo_stub);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    cfd::TransactionContext::AddInput(&ctx,&utxo_stub);
  }
  testing::Message::Message((Message *)local_1d30);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_1d50,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
             ,0x14f,
             "Expected: ctx.AddInput(utxo_stub) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d50,(Message *)local_1d30);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d50);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_1d30);
  cfd::UtxoData::~UtxoData(&utxo_stub);
  cfd::core::Address::~Address(&address2);
  cfd::core::Address::~Address(&address1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  cfd::TransactionContext::~TransactionContext(&ctx);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(&utxos);
  cfd::UtxoData::~UtxoData(&utxo4);
  cfd::UtxoData::~UtxoData(&utxo3);
  cfd::UtxoData::~UtxoData(&utxo2);
  cfd::UtxoData::~UtxoData(&utxo1);
  return;
}

Assistant:

TEST(TransactionContext, Input_Output) {
  // input-output test
  UtxoData utxo1;
  utxo1.txid = Txid("9e1ead91c432889cb478237da974dd1e9009c9e22694fd1e3999c40a1ef59b0a");
  utxo1.vout = 1;
  utxo1.address_type = AddressType::kP2wpkhAddress;
  UtxoData utxo2;
  utxo2.txid = Txid("8f4af7ee42e62a3d32f25ca56f618fb2f5df3d4c3a9c59e2c3646c5535a3d40a");
  utxo2.vout = 2;
  utxo2.address_type = AddressType::kP2wpkhAddress;
  UtxoData utxo3;
  utxo3.txid = Txid("b9720ed2265a4ced42425bffdb4ef90a473b4106811a802fce53f7c57487fa0b");
  utxo3.vout = 3;
  utxo3.address_type = AddressType::kP2wpkhAddress;
  UtxoData utxo4;
  utxo4.txid = Txid("0f093988839178ea5895431241cb4400fb31dd7b665a1a93cbd372336c717e0c");
  utxo4.vout = 4;
  utxo4.address_type = AddressType::kP2wpkhAddress;
  std::vector<UtxoData> utxos;
  utxos.push_back(utxo3);
  utxos.push_back(utxo4);

  TransactionContext ctx(2, 0);

  EXPECT_NO_THROW(ctx.AddInput(utxo1));
  EXPECT_NO_THROW(ctx.AddInput(utxo2, 0xf0ffffff));
  EXPECT_NO_THROW(ctx.AddInputs(utxos));
  std::vector<uint32_t> indexes(2);
  Address address1("3K4cCA6U45jhvBcgc8qEdjHGDGyUMuVRpG");
  Address address2("bc1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5uax7v9q");
  EXPECT_NO_THROW(indexes[0] = ctx.AddTxOut(address1, Amount(0.1)));
  EXPECT_NO_THROW(indexes[1] = ctx.AddTxOut(address2, Amount(0.01)));

  EXPECT_EQ(ctx.GetTxInCount(), 4);
  EXPECT_EQ(ctx.GetTxOutCount(), 2);
  EXPECT_EQ(ctx.GetSizeIgnoreTxIn(), 75);
  EXPECT_EQ(ctx.GetVsizeIgnoreTxIn(), 75);
  if (ctx.GetTxInCount() == 4) {
    auto ref_list = ctx.GetTxInList();
    EXPECT_STREQ(ref_list[0].GetTxid().GetHex().c_str(), utxo1.txid.GetHex().c_str());
    EXPECT_STREQ(ref_list[1].GetTxid().GetHex().c_str(), utxo2.txid.GetHex().c_str());
    EXPECT_STREQ(ref_list[2].GetTxid().GetHex().c_str(), utxo3.txid.GetHex().c_str());
    EXPECT_STREQ(ref_list[3].GetTxid().GetHex().c_str(), utxo4.txid.GetHex().c_str());
    EXPECT_EQ(ref_list[0].GetVout(), 1);
    EXPECT_EQ(ref_list[1].GetVout(), 2);
    EXPECT_EQ(ref_list[2].GetVout(), 3);
    EXPECT_EQ(ref_list[3].GetVout(), 4);
    EXPECT_EQ(ref_list[1].GetSequence(), 0xf0ffffff);
  }
  if (ctx.GetTxOutCount() == 2) {
    EXPECT_EQ(indexes[0], 0);
    EXPECT_EQ(indexes[1], 1);
    auto ref_list = ctx.GetTxOutList();
    EXPECT_STREQ(ref_list[0].GetLockingScript().GetHex().c_str(),
                 address1.GetLockingScript().GetHex().c_str());
    EXPECT_STREQ(ref_list[1].GetLockingScript().GetHex().c_str(),
                 address2.GetLockingScript().GetHex().c_str());
    EXPECT_EQ(ref_list[0].GetValue().GetCoinValue(), 0.1);
    EXPECT_EQ(ref_list[1].GetValue().GetCoinValue(), 0.01);
  }

  UtxoData utxo_stub;
  EXPECT_THROW(ctx.AddInput(utxo_stub), CfdException);
}